

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O0

cl_int xmrig::OclLib::release(cl_command_queue command_queue)

{
  char *fmt;
  char *pcVar1;
  cl_command_queue in_RDI;
  cl_int ret;
  cl_command_queue in_stack_ffffffffffffffe0;
  cl_int local_4;
  
  if (in_RDI == (cl_command_queue)0x0) {
    local_4 = 0;
  }
  else {
    finish(in_stack_ffffffffffffffe0);
    local_4 = (*pReleaseCommandQueue)(in_RDI);
    fmt = kErrorTemplate;
    if (local_4 != 0) {
      pcVar1 = OclError::toString(local_4);
      Log::print(ERR,fmt,pcVar1,kReleaseCommandQueue);
    }
  }
  return local_4;
}

Assistant:

cl_int xmrig::OclLib::release(cl_command_queue command_queue) noexcept
{
    assert(pReleaseCommandQueue != nullptr);
    assert(pGetCommandQueueInfo != nullptr);

    if (command_queue == nullptr) {
        return CL_SUCCESS;
    }

    LOG_REFS("%p %u ~queue", command_queue, getUint(command_queue, CL_QUEUE_REFERENCE_COUNT));

    finish(command_queue);

    cl_int ret = pReleaseCommandQueue(command_queue);
    if (ret != CL_SUCCESS) {
        LOG_ERR(kErrorTemplate, OclError::toString(ret), kReleaseCommandQueue);
    }

    return ret;
}